

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O2

void mem_put_varsize(uint8_t *dst,int sz,int val)

{
  switch(sz) {
  case 1:
    *dst = (uint8_t)val;
    return;
  case 2:
    *(short *)dst = (short)val;
    return;
  case 3:
    *dst = (uint8_t)val;
    dst[1] = (uint8_t)((uint)val >> 8);
    dst[2] = (uint8_t)((uint)val >> 0x10);
    return;
  case 4:
    *(int *)dst = val;
  }
  return;
}

Assistant:

static inline void mem_put_varsize(uint8_t *const dst, const int sz,
                                   const int val) {
  switch (sz) {
    case 1: dst[0] = (uint8_t)(val & 0xff); break;
    case 2: mem_put_le16(dst, val); break;
    case 3: mem_put_le24(dst, val); break;
    case 4: mem_put_le32(dst, val); break;
    default: assert(0 && "Invalid size"); break;
  }
}